

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeSStolerances(void *arkode_mem,sunrealtype reltol,sunrealtype abstol)

{
  double dVar1;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ARKodeMem ark_mem;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xfb,"ARKodeSStolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,0x104,"ARKodeSStolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (0.0 <= dVar1) {
      if (in_RDI->tempv1->ops->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0) {
        arkProcessError(in_RDI,-0x16,0x118,"ARKodeSStolerances",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"N_VAddConst unimplemented (required for scalar abstol)");
        local_4 = -0x16;
      }
      else {
        in_RDI->atolmin0 = (uint)(dVar1 == 0.0);
        in_RDI->reltol = in_XMM0_Qa;
        in_RDI->Sabstol = dVar1;
        in_RDI->itol = 0;
        in_RDI->user_efun = 0;
        in_RDI->efun = arkEwtSetSS;
        in_RDI->e_data = in_RDI;
        local_4 = 0;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,0x110,"ARKodeSStolerances",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                      ,"abstol has negative component(s) (illegal).");
      local_4 = -0x16;
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,0x10a,"ARKodeSStolerances",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int ARKodeSStolerances(void* arkode_mem, sunrealtype reltol, sunrealtype abstol)
{
  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (reltol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RELTOL);
    return (ARK_ILL_INPUT);
  }
  if (abstol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_ABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Ensure that vector supports N_VAddConst */
  if (!ark_mem->tempv1->ops->nvaddconst)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "N_VAddConst unimplemented (required for scalar abstol)");
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether abstol == 0 */
  ark_mem->atolmin0 = (abstol == ZERO);

  /* Copy tolerances into memory */
  ark_mem->reltol  = reltol;
  ark_mem->Sabstol = abstol;
  ark_mem->itol    = ARK_SS;

  /* enforce use of arkEwtSetSS */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSS;
  ark_mem->e_data    = ark_mem;

  return (ARK_SUCCESS);
}